

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_geti(lua_State *L,int idx,lua_Integer n)

{
  Table *t_00;
  TValue *t_01;
  TValue *io;
  TValue key;
  lua_Unsigned u;
  Table *h;
  lu_byte tag;
  TValue *t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  t_01 = index2value(L,idx);
  if (t_01->tt_ == 'E') {
    t_00 = (Table *)(t_01->value_).gc;
    key._8_8_ = n - 1;
    if ((ulong)key._8_8_ < (ulong)t_00->asize) {
      h._7_1_ = *(byte *)((long)t_00->array + n + 3);
      if ((h._7_1_ & 0xf) != 0) {
        *(byte *)((L->top).offset + 8) = h._7_1_;
        (((L->top).p)->val).value_ = t_00->array[-1 - key._8_8_];
      }
    }
    else {
      h._7_1_ = luaH_getint(t_00,n,&((L->top).p)->val);
    }
  }
  else {
    h._7_1_ = 0x30;
  }
  if ((h._7_1_ & 0xf) == 0) {
    key.value_.ub = '\x03';
    io = (TValue *)n;
    h._7_1_ = luaV_finishget(L,t_01,(TValue *)&io,(L->top).p,h._7_1_);
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return h._7_1_ & 0xf;
}

Assistant:

LUA_API int lua_geti (lua_State *L, int idx, lua_Integer n) {
  TValue *t;
  lu_byte tag;
  lua_lock(L);
  t = index2value(L, idx);
  luaV_fastgeti(t, n, s2v(L->top.p), tag);
  if (tagisempty(tag)) {
    TValue key;
    setivalue(&key, n);
    tag = luaV_finishget(L, t, &key, L->top.p, tag);
  }
  api_incr_top(L);
  lua_unlock(L);
  return novariant(tag);
}